

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O2

void __thiscall icu_63::Calendar::setRelatedYear(Calendar *this,int32_t year)

{
  int iVar1;
  ECalType EVar2;
  undefined4 extraout_var;
  
  iVar1 = (*(this->super_UObject)._vptr_UObject[0x17])();
  EVar2 = getCalendarType((char *)CONCAT44(extraout_var,iVar1));
  switch(EVar2) {
  case CALTYPE_PERSIAN:
    year = year + -0x26e;
    break;
  case CALTYPE_ISLAMIC_CIVIL:
  case CALTYPE_ISLAMIC:
  case CALTYPE_ISLAMIC_UMALQURA:
  case CALTYPE_ISLAMIC_TBLA:
  case CALTYPE_ISLAMIC_RGSA:
    if (year < 0x7b9) {
      iVar1 = (((0x7b8U - year) % 0x41 < 0x21) - 2) + ((0x7b8U - year) / 0x41) * -2;
    }
    else {
      iVar1 = (uint)(0x1f < (year - 0x7b9U) % 0x41) + ((year - 0x7b9U) / 0x41) * 2;
    }
    year = year + iVar1 + -0x243;
    break;
  case CALTYPE_HEBREW:
    year = year + 0xeb0;
    break;
  case CALTYPE_CHINESE:
    year = year + 0xa4d;
    break;
  case CALTYPE_INDIAN:
    year = year + -0x4f;
    break;
  case CALTYPE_COPTIC:
    year = year + -0x11c;
    break;
  case CALTYPE_ETHIOPIC:
    year = year + -8;
    break;
  case CALTYPE_ETHIOPIC_AMETE_ALEM:
    year = year + 0x1574;
    break;
  case CALTYPE_DANGI:
    year = year + 0x91d;
  }
  set(this,UCAL_EXTENDED_YEAR,year);
  return;
}

Assistant:

void Calendar::setRelatedYear(int32_t year)
{
    // modify for calendar type
    ECalType type = getCalendarType(getType());
    switch (type) {
        case CALTYPE_PERSIAN:
            year -= 622; break;
        case CALTYPE_HEBREW:
            year += 3760; break;
        case CALTYPE_CHINESE:
            year += 2637; break;
        case CALTYPE_INDIAN:
            year -= 79; break;
        case CALTYPE_COPTIC:
            year -= 284; break;
        case CALTYPE_ETHIOPIC:
            year -= 8; break;
        case CALTYPE_ETHIOPIC_AMETE_ALEM:
            year +=5492; break;
        case CALTYPE_DANGI:
            year += 2333; break;
        case CALTYPE_ISLAMIC_CIVIL:
        case CALTYPE_ISLAMIC:
        case CALTYPE_ISLAMIC_UMALQURA:
        case CALTYPE_ISLAMIC_TBLA:
        case CALTYPE_ISLAMIC_RGSA:
            year = firstIslamicStartYearFromGrego(year); break;
        default:
            // CALTYPE_GREGORIAN
            // CALTYPE_JAPANESE
            // CALTYPE_BUDDHIST
            // CALTYPE_ROC
            // CALTYPE_ISO8601
            // do nothing, EXTENDED_YEAR same as Gregorian
            break;
    }
    // set extended year
    set(UCAL_EXTENDED_YEAR, year);
}